

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fade.c
# Opt level: O3

int fade_segment_mix(mixed_segment *segment)

{
  undefined8 *puVar1;
  mixed_buffer *buffer;
  mixed_buffer *buffer_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float *pfVar4;
  uint uVar5;
  uint32_t size;
  code *pcVar6;
  ulong uVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  uint32_t samples;
  float *in;
  double local_78;
  uint32_t local_6c;
  double local_68;
  float local_60;
  float local_5c;
  float *local_58;
  double local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  float *local_30;
  
  puVar1 = (undefined8 *)segment->data;
  local_5c = *(float *)(puVar1 + 2);
  uVar5 = *(int *)((long)puVar1 + 0x1c) - 2;
  if (uVar5 < 3) {
    pcVar6 = (code *)(&PTR_fade_cubic_in_002ba860)[uVar5];
  }
  else {
    pcVar6 = fade_linear;
  }
  local_78 = (double)*(float *)((long)puVar1 + 0x24);
  local_68 = (double)CONCAT44(local_68._4_4_,*(undefined4 *)(puVar1 + 3));
  local_60 = *(float *)((long)puVar1 + 0x14) - local_5c;
  local_50 = (double)(1.0 / (float)*(uint *)(puVar1 + 4));
  local_6c = 0xffffffff;
  buffer = (mixed_buffer *)*puVar1;
  buffer_00 = (mixed_buffer *)puVar1[1];
  mixed_buffer_request_read(&local_58,&local_6c,buffer);
  pfVar4 = local_58;
  if (buffer == buffer_00) {
    if (local_6c != 0) {
      local_68 = (double)local_68._0_4_;
      uVar7 = 0;
      local_48 = 0x3ff0000000000000;
      uStack_40 = 0x3ff0000000000000;
      do {
        auVar16._8_8_ = 0;
        auVar16._0_8_ = local_68;
        auVar11._0_8_ = local_78 / local_68;
        auVar11._8_8_ = 0;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = local_78;
        auVar14 = vcmpsd_avx(auVar14,auVar16,1);
        auVar3._8_8_ = uStack_40;
        auVar3._0_8_ = local_48;
        auVar14 = vblendvpd_avx(auVar3,auVar11,auVar14);
        auVar12._0_4_ = (float)auVar14._0_8_;
        auVar12._4_12_ = auVar14._4_12_;
        fVar8 = (float)(*pcVar6)(auVar12._0_8_);
        pfVar4[uVar7] = (fVar8 * local_60 + local_5c) * local_58[uVar7];
        local_78 = local_78 + local_50;
        uVar7 = uVar7 + 1;
      } while (uVar7 < local_6c);
    }
  }
  else {
    mixed_buffer_request_write(&local_30,&local_6c,buffer_00);
    if (local_6c == 0) {
      size = 0;
    }
    else {
      local_68 = (double)local_68._0_4_;
      uVar7 = 0;
      local_48 = 0x3ff0000000000000;
      uStack_40 = 0x3ff0000000000000;
      do {
        auVar15._8_8_ = 0;
        auVar15._0_8_ = local_68;
        auVar9._0_8_ = local_78 / local_68;
        auVar9._8_8_ = 0;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = local_78;
        auVar14 = vcmpsd_avx(auVar13,auVar15,1);
        auVar2._8_8_ = uStack_40;
        auVar2._0_8_ = local_48;
        auVar14 = vblendvpd_avx(auVar2,auVar9,auVar14);
        auVar10._0_4_ = (float)auVar14._0_8_;
        auVar10._4_12_ = auVar14._4_12_;
        fVar8 = (float)(*pcVar6)(auVar10._0_8_);
        local_30[uVar7] = (fVar8 * local_60 + local_5c) * local_58[uVar7];
        local_78 = local_78 + local_50;
        uVar7 = uVar7 + 1;
        size = local_6c;
      } while (uVar7 < local_6c);
    }
    mixed_buffer_finish_read(size,buffer);
    mixed_buffer_finish_write(local_6c,buffer_00);
  }
  *(float *)((long)puVar1 + 0x24) = (float)local_78;
  return 1;
}

Assistant:

VECTORIZE int fade_segment_mix(struct mixed_segment *segment){
  struct fade_segment_data *data = (struct fade_segment_data *)segment->data;

  double time = data->time_passed;
  float endtime = data->time;
  float from = data->from;
  float range = data->to - data->from;
  double sampletime = 1.0f/data->samplerate;
  
  float (*ease)(float x);
  switch(data->type){
  case MIXED_LINEAR: ease = fade_linear; break;
  case MIXED_CUBIC_IN: ease = fade_cubic_in; break;
  case MIXED_CUBIC_OUT: ease = fade_cubic_out; break;
  case MIXED_CUBIC_IN_OUT: ease = fade_cubic_in_out; break;
  default: ease = fade_linear; break;
  }
  
  // NOTE: You could probably get away with having the same fade factor
  //       for the entirety of the sample range if the total duration
  //       of the buffer is small enough (~1ms?) as the human ear
  //       wouldn't be able to properly notice it.
  with_mixed_buffer_transfer(i, samples, in, data->in, out, data->out, {
      float x = (time < endtime)? time/endtime : 1.0f;
      float fade = from+ease(x)*range;
      out[i] = in[i]*fade;
      time += sampletime;
    });
  data->time_passed = time;
  return 1;
}